

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# City.cpp
# Opt level: O1

uint128 CityHashCrc128WithSeed(char *s,size_t len,uint128 seed)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint128 uVar4;
  uint64 result [4];
  uint64 local_38;
  long local_30;
  long local_28;
  long local_20;
  
  if (len < 0x385) {
    uVar4 = CityHash128WithSeed(s,len,seed);
  }
  else {
    CityHashCrc256(s,len,&local_38);
    uVar2 = seed.second + local_38;
    uVar3 = seed.first + local_30;
    uVar1 = (local_28 + uVar3 ^ uVar2) * -0x622015f714c7d297;
    uVar1 = (uVar1 >> 0x2f ^ local_28 + uVar3 ^ uVar1) * -0x622015f714c7d297;
    uVar2 = uVar2 * -0x3c5a37a36834ced9 + local_20;
    uVar3 = ((uVar3 >> 0x20 | uVar3 << 0x20) ^ uVar2) * -0x622015f714c7d297;
    uVar2 = (uVar3 >> 0x2f ^ uVar2 ^ uVar3) * -0x622015f714c7d297;
    uVar4.second = (uVar2 >> 0x2f ^ uVar2) * -0x622015f714c7d297;
    uVar4.first = (uVar1 >> 0x2f ^ uVar1) * -0x622015f714c7d297;
  }
  return uVar4;
}

Assistant:

uint128 CityHashCrc128WithSeed(const char *s, size_t len, uint128 seed) {
  if (len <= 900) {
    return CityHash128WithSeed(s, len, seed);
  } else {
    uint64 result[4];
    CityHashCrc256(s, len, result);
    uint64 u = Uint128High64(seed) + result[0];
    uint64 v = Uint128Low64(seed) + result[1];
    return uint128(HashLen16(u, v + result[2]),
                   HashLen16(Rotate(v, 32), u * k0 + result[3]));
  }
}